

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<Parser::IncludePath>::emplace<Parser::IncludePath>
          (QGenericArrayOps<Parser::IncludePath> *this,qsizetype i,IncludePath *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  Inserter *in_RDX;
  long in_RSI;
  IncludePath *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  IncludePath tmp;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined1 uVar5;
  undefined4 in_stack_ffffffffffffff68;
  undefined2 in_stack_ffffffffffffff6c;
  undefined1 in_stack_ffffffffffffff6e;
  byte bVar6;
  IncludePath *this_00;
  Inserter local_78;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  uVar1 = QArrayDataPointer<Parser::IncludePath>::needsDetach
                    ((QArrayDataPointer<Parser::IncludePath> *)in_RDI);
  if (!(bool)uVar1) {
    if ((in_RSI == (in_RDI->path).d.size) &&
       (qVar3 = QArrayDataPointer<Parser::IncludePath>::freeSpaceAtEnd
                          ((QArrayDataPointer<Parser::IncludePath> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT24(in_stack_ffffffffffffff6c,
                                                            in_stack_ffffffffffffff68)))),
       qVar3 != 0)) {
      QArrayDataPointer<Parser::IncludePath>::end((QArrayDataPointer<Parser::IncludePath> *)in_RDI);
      Parser::IncludePath::IncludePath
                (in_RDI,(IncludePath *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)
                );
      (in_RDI->path).d.size = (in_RDI->path).d.size + 1;
      goto LAB_001408e7;
    }
    if ((in_RSI == 0) &&
       (qVar3 = QArrayDataPointer<Parser::IncludePath>::freeSpaceAtBegin
                          ((QArrayDataPointer<Parser::IncludePath> *)
                           CONCAT17(uVar1,CONCAT16(in_stack_ffffffffffffff6e,
                                                   CONCAT24(in_stack_ffffffffffffff6c,
                                                            in_stack_ffffffffffffff68)))),
       qVar3 != 0)) {
      QArrayDataPointer<Parser::IncludePath>::begin
                ((QArrayDataPointer<Parser::IncludePath> *)0x14078a);
      Parser::IncludePath::IncludePath
                (in_RDI,(IncludePath *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58)
                );
      (in_RDI->path).d.ptr = (in_RDI->path).d.ptr + -0x20;
      (in_RDI->path).d.size = (in_RDI->path).d.size + 1;
      goto LAB_001408e7;
    }
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  Parser::IncludePath::IncludePath
            (in_RDI,(IncludePath *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  bVar4 = (in_RDI->path).d.size != 0;
  uVar5 = bVar4 && in_RSI == 0;
  uVar2 = (uint)(bVar4 && in_RSI == 0);
  bVar6 = uVar5;
  QArrayDataPointer<Parser::IncludePath>::detachAndGrow
            ((QArrayDataPointer<Parser::IncludePath> *)this_00,
             (GrowthPosition)((ulong)in_RSI >> 0x20),(qsizetype)in_RDX,
             (IncludePath **)
             CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff6c,uVar2))),
             (QArrayDataPointer<Parser::IncludePath> *)in_RDI);
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter(&local_78,(QArrayDataPointer<Parser::IncludePath> *)in_RDI);
    Inserter::insertOne(in_RDX,CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff6c,
                                                                      uVar2))),in_RDI);
    Inserter::~Inserter(&local_78);
  }
  else {
    QArrayDataPointer<Parser::IncludePath>::begin
              ((QArrayDataPointer<Parser::IncludePath> *)0x140877);
    Parser::IncludePath::IncludePath
              (in_RDI,(IncludePath *)CONCAT17(uVar5,in_stack_ffffffffffffff58));
    (in_RDI->path).d.ptr = (in_RDI->path).d.ptr + -0x20;
    (in_RDI->path).d.size = (in_RDI->path).d.size + 1;
  }
  Parser::IncludePath::~IncludePath((IncludePath *)0x1408e7);
LAB_001408e7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }